

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  pointer *ppbVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  reference puVar10;
  cmake *this_01;
  cmState *this_02;
  reference ppcVar11;
  size_t sVar12;
  allocator local_979;
  string local_978;
  string local_958;
  string local_938;
  allocator local_911;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  allocator local_889;
  value_type local_888;
  value_type local_868;
  string local_848;
  string local_828;
  undefined1 local_808 [8];
  ostringstream progCmd_1;
  string local_690;
  allocator local_669;
  string local_668 [8];
  string tmp;
  undefined1 local_628 [8];
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  string local_5d8;
  undefined1 local_5b8 [8];
  ostringstream progCmd;
  allocator local_439;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator local_3f1;
  string local_3f0;
  char *local_3d0;
  char *tgtMsg;
  string local_3c0 [7];
  bool targetMessages;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_398;
  iterator i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *progFiles;
  char *sep;
  ostringstream progressArg;
  undefined1 local_208 [8];
  EchoProgress progress;
  string local_1a8;
  string local_188;
  byte local_161;
  undefined1 local_160 [7];
  bool needRequiresStep;
  string local_140 [8];
  string makefileName;
  string name;
  cmGeneratorTarget *pcStack_f8;
  int type;
  cmGeneratorTarget *gtarget;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_e8;
  iterator t;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  value_type local_c0;
  undefined1 local_90 [8];
  string makeTargetName;
  string localName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmLocalUnixMakefileGenerator3 *lg_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&localName.field_2 + 8));
  std::__cxx11::string::string((string *)(makeTargetName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  WriteDirectoryRules2(this,ruleFileStream,lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"cmake_check_build_system",
             (allocator *)
             ((long)&targets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&targets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)lg);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t,__x);
  local_e8._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
  while( true ) {
    gtarget = (cmGeneratorTarget *)
              std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                        ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
    bVar2 = __gnu_cxx::operator!=
                      (&local_e8,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&gtarget);
    if (!bVar2) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_e8);
    pcStack_f8 = *ppcVar4;
    TVar3 = cmGeneratorTarget::GetType(pcStack_f8);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_f8);
    std::__cxx11::string::string((string *)(makefileName.field_2._M_local_buf + 8),(string *)psVar5)
    ;
    uVar6 = std::__cxx11::string::empty();
    if (((uVar6 & 1) == 0) &&
       ((((TVar3 == EXECUTABLE || (TVar3 == STATIC_LIBRARY)) || (TVar3 == SHARED_LIBRARY)) ||
        (((TVar3 == MODULE_LIBRARY || (TVar3 == OBJECT_LIBRARY)) || (TVar3 == UTILITY)))))) {
      std::__cxx11::string::string(local_140);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)local_160,lg,pcStack_f8);
      std::__cxx11::string::operator=
                ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::operator=(local_140,(string *)(makeTargetName.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::operator+=(local_140,"/build.make");
      local_161 = NeedRequiresStep(this,pcStack_f8);
      cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
      poVar7 = std::operator<<(ruleFileStream,"# Target rules for target ");
      poVar7 = std::operator<<(poVar7,(string *)(makeTargetName.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\n\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&localName.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)local_90,(string *)(makeTargetName.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_90,"/depend");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(&local_188,lg,pcVar8,(string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      if ((local_161 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)local_90,(string *)(makeTargetName.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_90,"/requires");
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(&local_1a8,lg,pcVar8,(string *)local_90)
        ;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&localName.field_2 + 8),&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::operator=
                ((string *)local_90,(string *)(makeTargetName.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_90,"/build");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)((long)&progress.Arg.field_2 + 8),lg,pcVar8,(string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),(value_type *)((long)&progress.Arg.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)(makeTargetName.field_2._M_local_buf + 8),"/all");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress((EchoProgress *)local_208);
      pcVar8 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)lg);
      std::__cxx11::string::operator=((string *)local_208,pcVar8);
      pcVar8 = cmake::GetCMakeFilesDirectory();
      std::__cxx11::string::operator+=((string *)local_208,pcVar8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
      progFiles = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb17e7c;
      pmVar9 = std::
               map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
               ::operator[](&this->ProgressMap,&stack0xffffffffffffff08);
      i._M_current = (unsigned_long *)&pmVar9->Marks;
      local_398._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i._M_current);
      while( true ) {
        local_3a0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(i._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_398,&local_3a0);
        if (!bVar2) break;
        poVar7 = std::operator<<((ostream *)&sep,(char *)progFiles);
        puVar10 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_398);
        std::ostream::operator<<(poVar7,*puVar10);
        progFiles = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb00ef7;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_398);
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)(progress.Dir.field_2._M_local_buf + 8),local_3c0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
      tgtMsg._7_1_ = 1;
      this_01 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      this_02 = cmake::GetState(this_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"TARGET_MESSAGES",&local_3f1);
      pcVar8 = cmState::GetGlobalProperty(this_02,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      local_3d0 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        tgtMsg._7_1_ = cmSystemTools::IsOn(pcVar8);
      }
      if ((tgtMsg._7_1_ & 1) != 0) {
        std::operator+(&local_418,"Built target ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&makefileName.field_2 + 8));
        cmLocalUnixMakefileGenerator3::AppendEcho
                  (lg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),&local_418,EchoNormal,
                   (EchoProgress *)local_208);
        std::__cxx11::string::~string((string *)&local_418);
      }
      AppendGlobalTargetDepends
                (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pcStack_f8);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"All Build rule for target.",
                 (string *)((long)&makeTargetName.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&localName.field_2 + 8),true,false);
      ppcVar11 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                           (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators,0);
      bVar2 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)this,*ppcVar11,pcStack_f8);
      if (!bVar2) {
        ppbVar1 = &commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)ppbVar1,(value_type *)((long)&makeTargetName.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&localName.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_438,"all",&local_439);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"Include target in all.",&local_438,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&localName.field_2 + 8),true,false);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator((allocator<char> *)&local_439);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&localName.field_2 + 8));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::operator<<((ostream *)local_5b8,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath
                ((string *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)local_208);
      cmOutputConverter::ConvertToOutputFormat
                (&local_5d8,
                 &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
                 (string *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,SHELL);
      std::operator<<((ostream *)local_5b8,(string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string
                ((string *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             *)local_628);
      poVar7 = std::operator<<((ostream *)local_5b8," ");
      sVar12 = CountProgressMarksInTarget
                         (this,pcStack_f8,
                          (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                           *)local_628);
      std::ostream::operator<<(poVar7,sVar12);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),(value_type *)((long)&tmp.field_2 + 8));
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
      std::
      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)local_628);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      pcVar8 = cmake::GetCMakeFilesDirectoryPostSlash();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,pcVar8,&local_669);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      std::__cxx11::string::operator+=(local_668,"Makefile2");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                (&local_690,lg,pcVar8,(string *)((long)&makeTargetName.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
      std::operator<<((ostream *)local_808,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath(&local_848,(string *)local_208);
      cmOutputConverter::ConvertToOutputFormat
                (&local_828,
                 &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
                 &local_848,SHELL);
      std::operator<<((ostream *)local_808,(string *)&local_828);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_848);
      std::operator<<((ostream *)local_808," 0");
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),&local_868);
      std::__cxx11::string::~string((string *)&local_868);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_888,"cmake_check_build_system",&local_889);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_888);
      std::__cxx11::string::~string((string *)&local_888);
      std::allocator<char>::~allocator((allocator<char> *)&local_889);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&local_8b0,lg,pcStack_f8)
      ;
      std::__cxx11::string::operator=
                ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_8b0);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::__cxx11::string::operator+=((string *)(makeTargetName.field_2._M_local_buf + 8),"/rule");
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"Build rule for subdir invocation for target.",
                 (string *)((long)&makeTargetName.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&localName.field_2 + 8),true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&localName.field_2 + 8));
      ppbVar1 = &commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ppbVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppbVar1,(value_type *)((long)&makeTargetName.field_2 + 8));
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"Convenience name for target.",
                 (string *)((long)&makefileName.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&localName.field_2 + 8),true,false);
      this_00 = pcStack_f8;
      psVar5 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(&lg->super_cmLocalCommonGenerator);
      bVar2 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,psVar5);
      if (bVar2) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_8d0,lg,pcStack_f8);
        std::__cxx11::string::operator=
                  ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::__cxx11::string::operator+=
                  ((string *)(makeTargetName.field_2._M_local_buf + 8),"/preinstall");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&localName.field_2 + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  (&local_8f0,lg,pcVar8,(string *)((long)&makeTargetName.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&localName.field_2 + 8),&local_8f0);
        std::__cxx11::string::~string((string *)&local_8f0);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"Pre-install relink rule for target.",
                   (string *)((long)&makeTargetName.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&localName.field_2 + 8),true,false);
        ppcVar11 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                             (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                               LocalGenerators,0);
        bVar2 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)this,*ppcVar11,pcStack_f8);
        if (!bVar2) {
          ppbVar1 = &commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppbVar1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppbVar1,(value_type *)((long)&makeTargetName.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_910,"preinstall",&local_911);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (lg,ruleFileStream,"Prepare target for install.",&local_910,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&localName.field_2 + 8),true,false);
          std::__cxx11::string::~string((string *)&local_910);
          std::allocator<char>::~allocator((allocator<char> *)&local_911);
        }
      }
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&local_938,lg,pcStack_f8)
      ;
      std::__cxx11::string::operator=
                ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::operator=
                ((string *)local_90,(string *)(makeTargetName.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_90,"/clean");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&localName.field_2 + 8));
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(&local_958,lg,pcVar8,(string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8),&local_958);
      std::__cxx11::string::~string((string *)&local_958);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"clean rule for target.",(string *)local_90,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&localName.field_2 + 8),true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&localName.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_978,"clean",&local_979);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"clean rule for target.",&local_978,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&localName.field_2 + 8),true,false);
      std::__cxx11::string::~string((string *)&local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      std::__cxx11::string::~string(local_668);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress((EchoProgress *)local_208);
      std::__cxx11::string::~string(local_140);
    }
    std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_e8);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(makeTargetName.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&localName.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  // write the directory level rules for this local gen
  this->WriteDirectoryRules2(ruleFileStream, lg);

  depends.push_back("cmake_check_build_system");

  // for each target Generate the rule files for each target.
  std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    cmGeneratorTarget* gtarget = *t;
    int type = gtarget->GetType();
    std::string name = gtarget->GetName();
    if (!name.empty() && ((type == cmStateEnums::EXECUTABLE) ||
                          (type == cmStateEnums::STATIC_LIBRARY) ||
                          (type == cmStateEnums::SHARED_LIBRARY) ||
                          (type == cmStateEnums::MODULE_LIBRARY) ||
                          (type == cmStateEnums::OBJECT_LIBRARY) ||
                          (type == cmStateEnums::UTILITY))) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makefileName = localName;
      makefileName += "/build.make";

      bool needRequiresStep = this->NeedRequiresStep(gtarget);

      lg->WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = localName;
      makeTargetName += "/depend";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));

      // add requires if we need it for this generator
      if (needRequiresStep) {
        makeTargetName = localName;
        makeTargetName += "/requires";
        commands.push_back(
          lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      }
      makeTargetName = localName;
      makeTargetName += "/build";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = lg->GetBinaryDirectory();
      progress.Dir += cmake::GetCMakeFilesDirectory();
      {
        std::ostringstream progressArg;
        const char* sep = "";
        std::vector<unsigned long>& progFiles =
          this->ProgressMap[gtarget].Marks;
        for (std::vector<unsigned long>::iterator i = progFiles.begin();
             i != progFiles.end(); ++i) {
          progressArg << sep << *i;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (const char* tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmSystemTools::IsOn(tgtMsg);
      }

      if (targetMessages) {
        lg->AppendEcho(commands, "Built target " + name,
                       cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget);
      lg->WriteMakeRule(ruleFileStream, "All Build rule for target.",
                        localName, depends, commands, true);

      // add the all/all dependency
      if (!this->IsExcluded(this->LocalGenerators[0], gtarget)) {
        depends.clear();
        depends.push_back(localName);
        commands.clear();
        lg->WriteMakeRule(ruleFileStream, "Include target in all.", "all",
                          depends, commands, true);
      }

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " " << this->CountProgressMarksInTarget(gtarget, emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = cmake::GetCMakeFilesDirectoryPostSlash();
      tmp += "Makefile2";
      commands.push_back(lg->GetRecursiveMakeCall(tmp.c_str(), localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      depends.push_back("cmake_check_build_system");
      localName = lg->GetRelativeTargetDirectory(gtarget);
      localName += "/rule";
      lg->WriteMakeRule(ruleFileStream,
                        "Build rule for subdir invocation for target.",
                        localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      lg->WriteMakeRule(ruleFileStream, "Convenience name for target.", name,
                        depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg->GetConfigName())) {
        localName = lg->GetRelativeTargetDirectory(gtarget);
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(
          lg->GetRecursiveMakeCall(makefileName.c_str(), localName));
        lg->WriteMakeRule(ruleFileStream,
                          "Pre-install relink rule for target.", localName,
                          depends, commands, true);

        if (!this->IsExcluded(this->LocalGenerators[0], gtarget)) {
          depends.clear();
          depends.push_back(localName);
          commands.clear();
          lg->WriteMakeRule(ruleFileStream, "Prepare target for install.",
                            "preinstall", depends, commands, true);
        }
      }

      // add the clean rule
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makeTargetName = localName;
      makeTargetName += "/clean";
      depends.clear();
      commands.clear();
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.",
                        makeTargetName, depends, commands, true);
      commands.clear();
      depends.push_back(makeTargetName);
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.", "clean",
                        depends, commands, true);
    }
  }
}